

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::ChangeSegmentProtection
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,DWORD protectFlags,
          DWORD expectedOldProtectFlags)

{
  char *address;
  PageAllocatorBaseCommon *pPVar1;
  HANDLE pVVar2;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  BOOL BVar6;
  HANDLE pVVar7;
  undefined4 *puVar8;
  AllocatorType *pAVar9;
  ulong uVar10;
  char *pcVar11;
  char *address_00;
  undefined1 auStack_78 [8];
  MEMORY_BASIC_INFORMATION info;
  DWORD local_40;
  DWORD local_3c;
  DWORD oldProtect;
  
  pPVar1 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).super_SegmentBaseCommon
           .allocator;
  pAVar9 = &pPVar1[-1].allocatorType;
  if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
    pAVar9 = (AllocatorType *)0x0;
  }
  pVVar2 = *(HANDLE *)(pAVar9 + 0x4a);
  info._44_4_ = protectFlags;
  local_3c = expectedOldProtectFlags;
  pVVar7 = GetCurrentProcess();
  if (pVVar2 != pVVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x203,"(this->GetAllocator()->processHandle == GetCurrentProcess())",
                       "this->GetAllocator()->processHandle == GetCurrentProcess()");
    if (!bVar5) {
LAB_00703b56:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  pPVar1 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).super_SegmentBaseCommon
           .allocator;
  address_00 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address;
  pAVar9 = &pPVar1[-1].allocatorType;
  if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
    pAVar9 = (AllocatorType *)0x0;
  }
  pcVar11 = address_00 + (pAVar9[0x28] << 0xc);
  if (address_00 < pcVar11) {
    _oldProtect = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      bVar5 = IsFreeOrDecommitted(this,address_00);
      if (!bVar5) {
        uVar4 = 0x1000;
        do {
          uVar10 = uVar4;
          address = address_00 + uVar10;
          if (pcVar11 <= address) break;
          bVar5 = IsFreeOrDecommitted(this,address);
          uVar4 = uVar10 + 0x1000;
        } while (!bVar5);
        if (0xfffffffe < uVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *_oldProtect = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x211,"(((uintptr_t)(endAddress - address)) < (2147483647 *2U +1U))",
                             "((uintptr_t)(endAddress - address)) < UINT_MAX");
          if (!bVar5) goto LAB_00703b56;
          *_oldProtect = 0;
        }
        local_40 = 0;
        info.RegionSize = 0;
        info.State = 0;
        info.Protect = 0;
        info.AllocationBase_PAL_Undefined = (PVOID)0x0;
        info.AllocationProtect = 0;
        info._20_4_ = 0;
        auStack_78 = (undefined1  [8])0x0;
        info.BaseAddress = (PVOID)0x0;
        VirtualQuery(address_00,(PMEMORY_BASIC_INFORMATION)auStack_78,0x30);
        if (info.RegionSize._4_4_ != local_3c) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *_oldProtect = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x218,"(info.Protect == expectedOldProtectFlags)",
                             "info.Protect == expectedOldProtectFlags");
          if (!bVar5) goto LAB_00703b56;
          *_oldProtect = 0;
        }
        BVar6 = VirtualProtect(address_00,uVar10 & 0xffffffff,info._44_4_,&local_40);
        puVar8 = _oldProtect;
        if (BVar6 != 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x21c,"(fSuccess == 1)","fSuccess == TRUE");
          if (!bVar5) goto LAB_00703b56;
          *puVar8 = 0;
        }
        address_00 = address;
        if (local_40 != local_3c) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x21d,"(oldProtect == expectedOldProtectFlags)",
                             "oldProtect == expectedOldProtectFlags");
          if (!bVar5) goto LAB_00703b56;
          *puVar8 = 0;
        }
      }
      address_00 = address_00 + 0x1000;
    } while (address_00 < pcVar11);
  }
  return;
}

Assistant:

void
PageSegmentBase<T>::ChangeSegmentProtection(DWORD protectFlags, DWORD expectedOldProtectFlags)
{
    // TODO: There is a discrepancy in PageSegmentBase
    // The segment page count is initialized in PageSegmentBase::Initialize. It takes into account
    // the guard pages + any additional pages for alignment.
    // However, the free page count is calculated for the segment before initialize is called.
    // In practice, what happens is the following. The initial segment page count is 256. This
    // ends up being the free page count too. When initialize is called, we allocate the guard
    // pages and the alignment pages, which causes the total page count to be 272. The segment
    // page count is then calculated as total - guard, which means 256 <= segmentPageCount < totalPageCount
    // The code in PageSegment's constructor will mark the pages between 256 and 272 as in use,
    // which is why it generally works. However, it breaks in the case where we want to know the end
    // address of the page. It should really be address + 256 * 4k but this->GetEndAddress will return
    // a value greater than that. Need to do a pass through the counts and make sure that it's rational.
    // For now, simply calculate the end address from the allocator's page count
    Assert(this->GetAllocator()->processHandle == GetCurrentProcess());

    char* segmentEndAddress = this->address + (this->GetAllocator()->GetMaxAllocPageCount() * AutoSystemInfo::PageSize);

    for (char* address = this->address; address < segmentEndAddress; address += AutoSystemInfo::PageSize)
    {
        if (!IsFreeOrDecommitted(address))
        {
            char* endAddress = address;
            do
            {
                endAddress += AutoSystemInfo::PageSize;
            } while (endAddress < segmentEndAddress && !IsFreeOrDecommitted(endAddress));

            Assert(((uintptr_t)(endAddress - address)) < UINT_MAX);
            DWORD regionSize = (DWORD) (endAddress - address);
            DWORD oldProtect = 0;

#if DBG
            MEMORY_BASIC_INFORMATION info = { 0 };
            VirtualQuery(address, &info, sizeof(MEMORY_BASIC_INFORMATION));
            Assert(info.Protect == expectedOldProtectFlags);
#endif

            BOOL fSuccess = VirtualProtect(address, regionSize, protectFlags, &oldProtect);
            Assert(fSuccess == TRUE);
            Assert(oldProtect == expectedOldProtectFlags);

            address = endAddress;
        }
    }
}